

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O1

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::GetInlinee
          (FunctionCodeGenJitTimeData *this,ProfileId profiledCallSiteId)

{
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *pWVar1;
  FunctionCodeGenJitTimeData *pFVar2;
  code *pcVar3;
  bool bVar4;
  FunctionBody *pFVar5;
  undefined4 *puVar6;
  FunctionCodeGenJitTimeData *local_28;
  
  pFVar5 = GetFunctionBody(this);
  if (pFVar5 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x53,"(GetFunctionBody())","GetFunctionBody()");
    if (!bVar4) goto LAB_00439e22;
    *puVar6 = 0;
  }
  pFVar5 = GetFunctionBody(this);
  if (pFVar5->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x54,
                                "(profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount())"
                                ,
                                "profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount()"
                               );
    if (!bVar4) {
LAB_00439e22:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pWVar1 = (this->inlinees).ptr;
  if (pWVar1 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    local_28 = (FunctionCodeGenJitTimeData *)0x0;
  }
  else {
    pFVar2 = pWVar1[profiledCallSiteId].ptr;
    Memory::Recycler::WBSetBit((char *)&local_28);
    local_28 = pFVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_28);
  }
  return local_28;
}

Assistant:

const FunctionCodeGenJitTimeData *FunctionCodeGenJitTimeData::GetInlinee(const ProfileId profiledCallSiteId) const
    {
        Assert(GetFunctionBody());
        Assert(profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount());

        return inlinees ? inlinees[profiledCallSiteId] : nullptr;
    }